

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,double>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  data_ptr_t pdVar1;
  char *pcVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  idx_t count_00;
  ulong uVar7;
  bool bVar8;
  string_t new_value;
  SelectionVector sel;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  Vector sort_key;
  UnifiedVectorFormat adata;
  Vector sliced_input;
  sel_t assign_sel [2048];
  char *local_2228;
  SelectionVector local_2220;
  Vector *local_2208;
  data_ptr_t local_2200;
  LogicalType local_21f8;
  UnifiedVectorFormat local_21e0;
  UnifiedVectorFormat local_2198;
  Vector local_2150;
  UnifiedVectorFormat local_20e8;
  Vector local_20a0;
  sel_t local_2038 [2050];
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_20e8);
  Vector::ToUnifiedFormat(inputs,count,&local_20e8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2198);
  Vector::ToUnifiedFormat(inputs + 1,count,&local_2198);
  local_2200 = local_2198.data;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_21e0);
  local_2208 = inputs;
  Vector::ToUnifiedFormat(state_vector,count,&local_21e0);
  if (count == 0) {
    count_00 = 0;
  }
  else {
    local_2228 = (char *)0x0;
    count_00 = 0;
    uVar7 = 0;
    do {
      uVar5 = uVar7;
      if ((local_2198.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_2198.sel)->sel_vector[uVar7];
      }
      if ((local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
           >> (uVar5 & 0x3f) & 1) != 0)) {
        pdVar1 = local_2200 + uVar5 * 8;
        local_2150.vector_type = pdVar1[0];
        local_2150._1_1_ = pdVar1[1];
        local_2150._2_1_ = pdVar1[2];
        local_2150._3_1_ = pdVar1[3];
        local_2150._4_1_ = pdVar1[4];
        local_2150._5_1_ = pdVar1[5];
        local_2150._6_1_ = pdVar1[6];
        local_2150._7_1_ = pdVar1[7];
        uVar5 = uVar7;
        if ((local_20e8.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(local_20e8.sel)->sel_vector[uVar7];
        }
        if (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar8 = true;
        }
        else {
          bVar8 = (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0;
        }
        uVar5 = uVar7;
        if ((local_21e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(local_21e0.sel)->sel_vector[uVar7];
        }
        pcVar2 = *(char **)(local_21e0.data + uVar5 * 8);
        if ((*pcVar2 != '\x01') ||
           (bVar4 = GreaterThan::Operation<double>((double *)(pcVar2 + 0x18),(double *)&local_2150),
           bVar4)) {
          pcVar2[0x18] = local_2150.vector_type;
          pcVar2[0x19] = local_2150._1_1_;
          pcVar2[0x1a] = local_2150._2_1_;
          pcVar2[0x1b] = local_2150._3_1_;
          pcVar2[0x1c] = local_2150._4_1_;
          pcVar2[0x1d] = local_2150._5_1_;
          pcVar2[0x1e] = local_2150._6_1_;
          pcVar2[0x1f] = local_2150._7_1_;
          pcVar2[1] = bVar8 ^ 1;
          if (bVar8 != false) {
            lVar6 = count_00 - (pcVar2 == local_2228);
            local_2038[lVar6] = (sel_t)uVar7;
            count_00 = lVar6 + 1;
            local_2228 = pcVar2;
          }
          *pcVar2 = '\x01';
        }
      }
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
  }
  if (count_00 != 0) {
    LogicalType::LogicalType(&local_21f8,BLOB);
    Vector::Vector(&local_2150,&local_21f8,0x800);
    LogicalType::~LogicalType(&local_21f8);
    local_2220.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2220.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2220.sel_vector = local_2038;
    Vector::Vector(&local_20a0,local_2208,&local_2220,count_00);
    CreateSortKeyHelpers::CreateSortKey(&local_20a0,count_00,(OrderModifiers)0x302,&local_2150);
    local_2150.data = local_2150.data + 8;
    uVar7 = 0;
    do {
      uVar5 = uVar7;
      if (local_2220.sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)local_2220.sel_vector[uVar7];
      }
      psVar3 = (local_21e0.sel)->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar3[uVar5];
      }
      new_value.value.pointer.ptr = (char *)psVar3;
      new_value.value._0_8_ = *(undefined8 *)local_2150.data;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(local_21e0.data + uVar5 * 8) + 8),
                 *(string_t **)(local_2150.data + -8),new_value);
      uVar7 = uVar7 + 1;
      local_2150.data = local_2150.data + 0x10;
    } while (count_00 + (count_00 == 0) != uVar7);
    if (local_20a0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_20a0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_20a0.type);
    if (local_2220.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2220.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2150.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2150.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2150.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2150.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_2150.type);
  }
  if (local_21e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_21e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2198.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20e8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}